

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::SetValue(PInt *this,void *addr,int val)

{
  int val_local;
  void *addr_local;
  PInt *this_local;
  
  if (((ulong)addr & (ulong)(*(int *)&this->field_0x28 - 1)) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x3d3,"virtual void PInt::SetValue(void *, int)");
  }
  if (*(int *)&this->field_0x24 == 4) {
    *(int *)addr = val;
  }
  else if (*(int *)&this->field_0x24 == 1) {
    *(char *)addr = (char)val;
  }
  else if (*(int *)&this->field_0x24 == 2) {
    *(short *)addr = (short)val;
  }
  else {
    if (*(int *)&this->field_0x24 != 8) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x3e6,"virtual void PInt::SetValue(void *, int)");
    }
    *(long *)addr = (long)val;
  }
  return;
}

Assistant:

void PInt::SetValue(void *addr, int val)
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		*(int *)addr = val;
	}
	else if (Size == 1)
	{
		*(BYTE *)addr = val;
	}
	else if (Size == 2)
	{
		*(WORD *)addr = val;
	}
	else if (Size == 8)
	{
		*(QWORD *)addr = val;
	}
	else
	{
		assert(0 && "Unhandled integer size");
	}
}